

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordDescriptor.h
# Opt level: O0

void aeron::concurrent::ringbuffer::RecordDescriptor::checkMsgTypeId(int32_t msgTypeId)

{
  IllegalArgumentException *this;
  char *pcVar1;
  int in_EDI;
  allocator *filename;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  int local_4;
  
  if (in_EDI < 1) {
    local_4 = in_EDI;
    this = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_48,local_4);
    std::operator+(&local_28,"Message type id must be greater than zero, msgTypeId=",&local_48);
    filename = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "void aeron::concurrent::ringbuffer::RecordDescriptor::checkMsgTypeId(std::int32_t)",
               filename);
    pcVar1 = util::past_prefix((char *)this,(char *)filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,pcVar1,&local_a1);
    util::IllegalArgumentException::IllegalArgumentException
              (this,&local_28,&local_78,&local_a0,0x56);
    __cxa_throw(this,&util::IllegalArgumentException::typeinfo,
                util::IllegalArgumentException::~IllegalArgumentException);
  }
  return;
}

Assistant:

inline static void checkMsgTypeId(std::int32_t msgTypeId)
    {
        if (msgTypeId < 1)
        {
            throw util::IllegalArgumentException(
                "Message type id must be greater than zero, msgTypeId=" + std::to_string(msgTypeId), SOURCEINFO);
        }
    }